

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

nni_msg * nni_msg_pull_up(nni_msg *m)

{
  uint8_t *__dest;
  size_t __n;
  int iVar1;
  nni_msg *local_30;
  nni_msg *m2;
  
  if ((m->m_header_len <= (m->m_body).ch_cap - (m->m_body).ch_len) &&
     (iVar1 = nni_atomic_get(&m->m_refcnt), iVar1 == 1)) {
    nni_msg_insert(m,m,m->m_header_len);
    m->m_header_len = 0;
    return m;
  }
  iVar1 = nni_msg_alloc(&local_30,m->m_header_len + (m->m_body).ch_len);
  if (iVar1 == 0) {
    __dest = (local_30->m_body).ch_ptr;
    __n = m->m_header_len;
    memcpy(__dest,m,__n);
    memcpy(__dest + __n,(m->m_body).ch_ptr,(m->m_body).ch_len);
    nni_msg_free(m);
  }
  else {
    local_30 = (nni_msg *)0x0;
  }
  return local_30;
}

Assistant:

nni_msg *
nni_msg_pull_up(nni_msg *m)
{
	// This implementation is optimized to ensure that this function
	// will not copy the message more than once, and it will not
	// allocate unless there is no other option.
	if (((nni_chunk_room(&m->m_body) < nni_msg_header_len(m))) ||
	    (nni_atomic_get(&m->m_refcnt) != 1)) {
		// We have to duplicate the message.
		nni_msg *m2;
		uint8_t *dst;
		size_t   len = nni_msg_len(m) + nni_msg_header_len(m);
		if (nni_msg_alloc(&m2, len) != 0) {
			return (NULL);
		}
		dst = nni_msg_body(m2);
		len = nni_msg_header_len(m);
		memcpy(dst, nni_msg_header(m), len);
		dst += len;
		memcpy(dst, nni_msg_body(m), nni_msg_len(m));
		nni_msg_free(m);
		return (m2);
	}

	// At this point, we have a unique instance of the message.
	// We also know that we have sufficient space in the message,
	// so this insert operation cannot fail.
	nni_msg_insert(m, nni_msg_header(m), nni_msg_header_len(m));
	nni_msg_header_clear(m);
	return (m);
}